

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

bool __thiscall SessionManager::haveROSession(SessionManager *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  reference ppSVar2;
  Slot *this_00;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *in_RSI;
  iterator i;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> local_30 [3];
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  MutexLocker::MutexLocker
            ((MutexLocker *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  local_30[0]._M_current =
       (Session **)
       std::vector<Session_*,_std::allocator<Session_*>_>::begin
                 ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff88);
  do {
    std::vector<Session_*,_std::allocator<Session_*>_>::end
              ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      local_1 = 0;
LAB_001e8985:
      MutexLocker::~MutexLocker
                ((MutexLocker *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      return (bool)(local_1 & 1);
    }
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
              operator*(local_30);
    if (*ppSVar2 != (Session *)0x0) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
                operator*(local_30);
      this_00 = Session::getSlot(*ppSVar2);
      in_stack_ffffffffffffff98 =
           (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *)
           Slot::getSlotID(this_00);
      if (in_stack_ffffffffffffff98 == local_18) {
        ppSVar2 = __gnu_cxx::
                  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                  ::operator*(local_30);
        bVar1 = Session::isRW(*ppSVar2);
        in_stack_ffffffffffffff94 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
        if (!bVar1) {
          local_1 = 1;
          goto LAB_001e8985;
        }
      }
    }
    __gnu_cxx::__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
    operator++(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  } while( true );
}

Assistant:

bool SessionManager::haveROSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() != slotID) continue;

		if ((*i)->isRW() == false) return true;
	}

	return false;
}